

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O0

void __thiscall
Assimp::AssbinImporter::ReadBinaryMesh(AssbinImporter *this,IOStream *stream,aiMesh *mesh)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  unsigned_short uVar9;
  uint uVar10;
  uint uVar11;
  DeadlyImportError *this_00;
  aiColor4D *paVar12;
  aiVector3D *paVar13;
  ulong uVar14;
  ulong *puVar15;
  uint *puVar16;
  ulong uVar17;
  aiBone **ppaVar18;
  aiBone *this_01;
  aiFace *paVar19;
  ulong uVar20;
  aiFace *local_198;
  aiVector3t<float> *local_170;
  aiColor4t<float> *local_148;
  aiVector3t<float> *local_120;
  aiVector3t<float> *local_f8;
  aiVector3t<float> *local_d0;
  aiVector3t<float> *local_a8;
  uint local_78;
  uint local_74;
  uint a_1;
  uint a;
  aiFace *f;
  uint i;
  uint n_1;
  uint n;
  uint c;
  allocator<char> local_41;
  string local_40;
  aiMesh *local_20;
  aiMesh *mesh_local;
  IOStream *stream_local;
  AssbinImporter *this_local;
  
  local_20 = mesh;
  mesh_local = (aiMesh *)stream;
  stream_local = (IOStream *)this;
  uVar10 = Read<unsigned_int>(stream);
  if (uVar10 == 0x1237) {
    Read<unsigned_int>((IOStream *)mesh_local);
    uVar10 = Read<unsigned_int>((IOStream *)mesh_local);
    local_20->mPrimitiveTypes = uVar10;
    uVar10 = Read<unsigned_int>((IOStream *)mesh_local);
    local_20->mNumVertices = uVar10;
    uVar10 = Read<unsigned_int>((IOStream *)mesh_local);
    local_20->mNumFaces = uVar10;
    uVar10 = Read<unsigned_int>((IOStream *)mesh_local);
    local_20->mNumBones = uVar10;
    uVar10 = Read<unsigned_int>((IOStream *)mesh_local);
    local_20->mMaterialIndex = uVar10;
    uVar10 = Read<unsigned_int>((IOStream *)mesh_local);
    if ((uVar10 & 1) != 0) {
      if ((this->shortened & 1U) == 0) {
        uVar17 = CONCAT44(0,local_20->mNumVertices);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar17;
        uVar14 = SUB168(auVar7 * ZEXT816(0xc),0);
        if (SUB168(auVar7 * ZEXT816(0xc),8) != 0) {
          uVar14 = 0xffffffffffffffff;
        }
        paVar13 = (aiVector3D *)operator_new__(uVar14);
        if (uVar17 != 0) {
          local_a8 = paVar13;
          do {
            aiVector3t<float>::aiVector3t(local_a8);
            local_a8 = local_a8 + 1;
          } while (local_a8 != paVar13 + uVar17);
        }
        local_20->mVertices = paVar13;
        ReadArray<aiVector3t<float>>
                  ((IOStream *)mesh_local,local_20->mVertices,local_20->mNumVertices);
      }
      else {
        ReadBounds<aiVector3t<float>>
                  ((IOStream *)mesh_local,local_20->mVertices,local_20->mNumVertices);
      }
    }
    if ((uVar10 & 2) != 0) {
      if ((this->shortened & 1U) == 0) {
        uVar17 = CONCAT44(0,local_20->mNumVertices);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar17;
        uVar14 = SUB168(auVar1 * ZEXT816(0xc),0);
        if (SUB168(auVar1 * ZEXT816(0xc),8) != 0) {
          uVar14 = 0xffffffffffffffff;
        }
        paVar13 = (aiVector3D *)operator_new__(uVar14);
        if (uVar17 != 0) {
          local_d0 = paVar13;
          do {
            aiVector3t<float>::aiVector3t(local_d0);
            local_d0 = local_d0 + 1;
          } while (local_d0 != paVar13 + uVar17);
        }
        local_20->mNormals = paVar13;
        ReadArray<aiVector3t<float>>
                  ((IOStream *)mesh_local,local_20->mNormals,local_20->mNumVertices);
      }
      else {
        ReadBounds<aiVector3t<float>>
                  ((IOStream *)mesh_local,local_20->mNormals,local_20->mNumVertices);
      }
    }
    if ((uVar10 & 4) != 0) {
      if ((this->shortened & 1U) == 0) {
        uVar17 = CONCAT44(0,local_20->mNumVertices);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar17;
        uVar14 = SUB168(auVar2 * ZEXT816(0xc),0);
        if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
          uVar14 = 0xffffffffffffffff;
        }
        paVar13 = (aiVector3D *)operator_new__(uVar14);
        if (uVar17 != 0) {
          local_f8 = paVar13;
          do {
            aiVector3t<float>::aiVector3t(local_f8);
            local_f8 = local_f8 + 1;
          } while (local_f8 != paVar13 + uVar17);
        }
        local_20->mTangents = paVar13;
        ReadArray<aiVector3t<float>>
                  ((IOStream *)mesh_local,local_20->mTangents,local_20->mNumVertices);
        uVar17 = CONCAT44(0,local_20->mNumVertices);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar17;
        uVar14 = SUB168(auVar3 * ZEXT816(0xc),0);
        if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
          uVar14 = 0xffffffffffffffff;
        }
        paVar13 = (aiVector3D *)operator_new__(uVar14);
        if (uVar17 != 0) {
          local_120 = paVar13;
          do {
            aiVector3t<float>::aiVector3t(local_120);
            local_120 = local_120 + 1;
          } while (local_120 != paVar13 + uVar17);
        }
        local_20->mBitangents = paVar13;
        ReadArray<aiVector3t<float>>
                  ((IOStream *)mesh_local,local_20->mBitangents,local_20->mNumVertices);
      }
      else {
        ReadBounds<aiVector3t<float>>
                  ((IOStream *)mesh_local,local_20->mTangents,local_20->mNumVertices);
        ReadBounds<aiVector3t<float>>
                  ((IOStream *)mesh_local,local_20->mBitangents,local_20->mNumVertices);
      }
    }
    i = 0;
    while ((i < 8 && ((uVar10 & 0x10000 << ((byte)i & 0x1f)) != 0))) {
      if ((this->shortened & 1U) == 0) {
        uVar17 = CONCAT44(0,local_20->mNumVertices);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar17;
        uVar14 = SUB168(auVar4 * ZEXT816(0x10),0);
        if (SUB168(auVar4 * ZEXT816(0x10),8) != 0) {
          uVar14 = 0xffffffffffffffff;
        }
        paVar12 = (aiColor4D *)operator_new__(uVar14);
        if (uVar17 != 0) {
          local_148 = paVar12;
          do {
            aiColor4t<float>::aiColor4t(local_148);
            local_148 = local_148 + 1;
          } while (local_148 != paVar12 + uVar17);
        }
        local_20->mColors[i] = paVar12;
        ReadArray<aiColor4t<float>>
                  ((IOStream *)mesh_local,local_20->mColors[i],local_20->mNumVertices);
      }
      else {
        ReadBounds<aiColor4t<float>>
                  ((IOStream *)mesh_local,local_20->mColors[i],local_20->mNumVertices);
      }
      i = i + 1;
    }
    f._4_4_ = 0;
    while ((f._4_4_ < 8 && ((uVar10 & 0x100 << ((byte)f._4_4_ & 0x1f)) != 0))) {
      uVar11 = Read<unsigned_int>((IOStream *)mesh_local);
      local_20->mNumUVComponents[f._4_4_] = uVar11;
      if ((this->shortened & 1U) == 0) {
        uVar17 = CONCAT44(0,local_20->mNumVertices);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar17;
        uVar14 = SUB168(auVar5 * ZEXT816(0xc),0);
        if (SUB168(auVar5 * ZEXT816(0xc),8) != 0) {
          uVar14 = 0xffffffffffffffff;
        }
        paVar13 = (aiVector3D *)operator_new__(uVar14);
        if (uVar17 != 0) {
          local_170 = paVar13;
          do {
            aiVector3t<float>::aiVector3t(local_170);
            local_170 = local_170 + 1;
          } while (local_170 != paVar13 + uVar17);
        }
        local_20->mTextureCoords[f._4_4_] = paVar13;
        ReadArray<aiVector3t<float>>
                  ((IOStream *)mesh_local,local_20->mTextureCoords[f._4_4_],local_20->mNumVertices);
      }
      else {
        ReadBounds<aiVector3t<float>>
                  ((IOStream *)mesh_local,local_20->mTextureCoords[f._4_4_],local_20->mNumVertices);
      }
      f._4_4_ = f._4_4_ + 1;
    }
    if ((this->shortened & 1U) == 0) {
      uVar17 = CONCAT44(0,local_20->mNumFaces);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar17;
      uVar14 = SUB168(auVar6 * ZEXT816(0x10),0);
      uVar20 = uVar14 + 8;
      if (SUB168(auVar6 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar14) {
        uVar20 = 0xffffffffffffffff;
      }
      puVar15 = (ulong *)operator_new__(uVar20);
      *puVar15 = uVar17;
      paVar19 = (aiFace *)(puVar15 + 1);
      if (uVar17 != 0) {
        local_198 = paVar19;
        do {
          aiFace::aiFace(local_198);
          local_198 = local_198 + 1;
        } while (local_198 != paVar19 + uVar17);
      }
      local_20->mFaces = paVar19;
      for (f._0_4_ = 0; (uint)f < local_20->mNumFaces; f._0_4_ = (uint)f + 1) {
        paVar19 = local_20->mFaces + (uint)f;
        uVar9 = Read<unsigned_short>((IOStream *)mesh_local);
        paVar19->mNumIndices = (uint)uVar9;
        auVar7 = ZEXT416(paVar19->mNumIndices) * ZEXT816(4);
        uVar17 = auVar7._0_8_;
        if (auVar7._8_8_ != 0) {
          uVar17 = 0xffffffffffffffff;
        }
        puVar16 = (uint *)operator_new__(uVar17);
        paVar19->mIndices = puVar16;
        for (local_74 = 0; local_74 < paVar19->mNumIndices; local_74 = local_74 + 1) {
          bVar8 = fitsIntoUI16(local_20->mNumVertices);
          if (bVar8) {
            uVar9 = Read<unsigned_short>((IOStream *)mesh_local);
            paVar19->mIndices[local_74] = (uint)uVar9;
          }
          else {
            uVar10 = Read<unsigned_int>((IOStream *)mesh_local);
            paVar19->mIndices[local_74] = uVar10;
          }
        }
      }
    }
    else {
      Read<unsigned_int>((IOStream *)mesh_local);
    }
    if (local_20->mNumBones != 0) {
      auVar7 = ZEXT416(local_20->mNumBones) * ZEXT816(8);
      uVar17 = auVar7._0_8_;
      if (auVar7._8_8_ != 0) {
        uVar17 = 0xffffffffffffffff;
      }
      ppaVar18 = (aiBone **)operator_new__(uVar17);
      local_20->mBones = ppaVar18;
      for (local_78 = 0; local_78 < local_20->mNumBones; local_78 = local_78 + 1) {
        this_01 = (aiBone *)operator_new(0x450);
        aiBone::aiBone(this_01);
        local_20->mBones[local_78] = this_01;
        ReadBinaryBone(this,(IOStream *)mesh_local,local_20->mBones[local_78]);
      }
    }
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Magic chunk identifiers are wrong!",&local_41);
  DeadlyImportError::DeadlyImportError(this_00,&local_40);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void AssbinImporter::ReadBinaryMesh( IOStream * stream, aiMesh* mesh ) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AIMESH)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    mesh->mPrimitiveTypes = Read<unsigned int>(stream);
    mesh->mNumVertices = Read<unsigned int>(stream);
    mesh->mNumFaces = Read<unsigned int>(stream);
    mesh->mNumBones = Read<unsigned int>(stream);
    mesh->mMaterialIndex = Read<unsigned int>(stream);

    // first of all, write bits for all existent vertex components
    unsigned int c = Read<unsigned int>(stream);

    if (c & ASSBIN_MESH_HAS_POSITIONS) {
        if (shortened) {
            ReadBounds(stream,mesh->mVertices,mesh->mNumVertices);
        }  else {
            // else write as usual
            mesh->mVertices = new aiVector3D[mesh->mNumVertices];
            ReadArray<aiVector3D>(stream,mesh->mVertices,mesh->mNumVertices);
        }
    }
    if (c & ASSBIN_MESH_HAS_NORMALS) {
        if (shortened) {
            ReadBounds(stream,mesh->mNormals,mesh->mNumVertices);
        }  else {
            // else write as usual
            mesh->mNormals = new aiVector3D[mesh->mNumVertices];
            ReadArray<aiVector3D>(stream,mesh->mNormals,mesh->mNumVertices);
        }
    }
    if (c & ASSBIN_MESH_HAS_TANGENTS_AND_BITANGENTS) {
        if (shortened) {
            ReadBounds(stream,mesh->mTangents,mesh->mNumVertices);
            ReadBounds(stream,mesh->mBitangents,mesh->mNumVertices);
        }  else {
            // else write as usual
            mesh->mTangents = new aiVector3D[mesh->mNumVertices];
            ReadArray<aiVector3D>(stream,mesh->mTangents,mesh->mNumVertices);
            mesh->mBitangents = new aiVector3D[mesh->mNumVertices];
            ReadArray<aiVector3D>(stream,mesh->mBitangents,mesh->mNumVertices);
        }
    }
    for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_COLOR_SETS;++n) {
        if (!(c & ASSBIN_MESH_HAS_COLOR(n))) {
            break;
        }

        if (shortened) {
            ReadBounds(stream,mesh->mColors[n],mesh->mNumVertices);
        }  else {
            // else write as usual
            mesh->mColors[n] = new aiColor4D[mesh->mNumVertices];
            ReadArray<aiColor4D>(stream,mesh->mColors[n],mesh->mNumVertices);
        }
    }
    for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n) {
        if (!(c & ASSBIN_MESH_HAS_TEXCOORD(n))) {
            break;
        }

        // write number of UV components
        mesh->mNumUVComponents[n] = Read<unsigned int>(stream);

        if (shortened) {
            ReadBounds(stream,mesh->mTextureCoords[n],mesh->mNumVertices);
        }  else {
            // else write as usual
            mesh->mTextureCoords[n] = new aiVector3D[mesh->mNumVertices];
            ReadArray<aiVector3D>(stream,mesh->mTextureCoords[n],mesh->mNumVertices);
        }
    }

    // write faces. There are no floating-point calculations involved
    // in these, so we can write a simple hash over the face data
    // to the dump file. We generate a single 32 Bit hash for 512 faces
    // using Assimp's standard hashing function.
    if (shortened) {
        Read<unsigned int>(stream);
    } else  {
        // else write as usual
        // if there are less than 2^16 vertices, we can simply use 16 bit integers ...
        mesh->mFaces = new aiFace[mesh->mNumFaces];
        for (unsigned int i = 0; i < mesh->mNumFaces;++i) {
            aiFace& f = mesh->mFaces[i];

            static_assert(AI_MAX_FACE_INDICES <= 0xffff, "AI_MAX_FACE_INDICES <= 0xffff");
            f.mNumIndices = Read<uint16_t>(stream);
            f.mIndices = new unsigned int[f.mNumIndices];

            for (unsigned int a = 0; a < f.mNumIndices;++a) {
                // Check if unsigned  short ( 16 bit  ) are big enought for the indices
                if ( fitsIntoUI16( mesh->mNumVertices ) ) {
                    f.mIndices[a] = Read<uint16_t>(stream);
                } else {
                    f.mIndices[a] = Read<unsigned int>(stream);
                }
            }
        }
    }

    // write bones
    if (mesh->mNumBones) {
        mesh->mBones = new C_STRUCT aiBone*[mesh->mNumBones];
        for (unsigned int a = 0; a < mesh->mNumBones;++a) {
            mesh->mBones[a] = new aiBone();
            ReadBinaryBone(stream,mesh->mBones[a]);
        }
    }
}